

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_35::InMemoryFile::mmapWritable(InMemoryFile *this,uint64_t offset,uint64_t size)

{
  long lVar1;
  _func_int **pp_Var2;
  _func_int *in_RCX;
  WritableFileMapping *extraout_RDX;
  Own<const_kj::WritableFileMapping> OVar3;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Own<const_kj::(anonymous_namespace)::InMemoryFile> local_40;
  
  if (!CARRY8((ulong)in_RCX,size)) {
    _::Mutex::lock((Mutex *)(offset + 0x18),EXCLUSIVE);
    lock.ptr = (Impl *)(offset + 0x30);
    lock.mutex = (Mutex *)(offset + 0x18);
    Impl::ensureCapacity(lock.ptr,(size_t)(in_RCX + size));
    LOCK();
    *(int *)(offset + 0x10) = *(int *)(offset + 0x10) + 1;
    UNLOCK();
    lVar1 = *(long *)(offset + 0x38);
    local_40.disposer = (Disposer *)(offset + 8);
    local_40.ptr = (InMemoryFile *)offset;
    pp_Var2 = (_func_int **)operator_new(0x28);
    *pp_Var2 = (_func_int *)&PTR_get_002a7fa8;
    pp_Var2[1] = (_func_int *)(offset + 8);
    pp_Var2[2] = (_func_int *)offset;
    local_40.ptr = (InMemoryFile *)0x0;
    pp_Var2[3] = (_func_int *)(lVar1 + size);
    pp_Var2[4] = in_RCX;
    *(int *)(offset + 0x60) = *(int *)(offset + 0x60) + 1;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var2;
    Own<const_kj::(anonymous_namespace)::InMemoryFile>::~Own(&local_40);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&lock);
    OVar3.ptr = extraout_RDX;
    OVar3.disposer = (Disposer *)this;
    return OVar3;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            ((Fault *)&lock,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x366,FAILED,"end >= offset","\"mmapWritable() request overflows uint64\"",
             (char (*) [40])"mmapWritable() request overflows uint64");
  _::Debug::Fault::fatal((Fault *)&lock);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    uint64_t end = offset + size;
    KJ_REQUIRE(end >= offset, "mmapWritable() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(end);
    return heap<WritableFileMappingImpl>(atomicAddRef(*this), lock->bytes.slice(offset, end));
  }